

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O0

void __thiscall BufferInputSource::~BufferInputSource(BufferInputSource *this)

{
  BufferInputSource *this_local;
  
  ~BufferInputSource(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

BufferInputSource::~BufferInputSource()
{
    if (this->own_memory) {
        delete this->buf;
    }
}